

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

any * __thiscall
Omega_h::InputYamlReader::seq_next_item
          (any *__return_storage_ptr__,InputYamlReader *this,any *items,any *next_item)

{
  bool bVar1;
  InputList *pIVar2;
  type_info *ptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  InputScalar *this_00;
  InputMap *pIVar5;
  ParserFail *this_01;
  shared_ptr<Omega_h::Input> sptr;
  string value;
  InputList list;
  
  pIVar2 = any_cast<Omega_h::InputList&&>(items);
  InputList::InputList(&list,pIVar2);
  if (next_item->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*next_item->vtable->type)();
  }
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    pbVar4 = any_cast<std::__cxx11::string&&>(next_item);
    std::__cxx11::string::string((string *)&value,(string *)pbVar4);
    this_00 = (InputScalar *)operator_new(0x38);
    InputScalar::InputScalar(this_00,&value);
    std::__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Omega_h::InputScalar,void>
              ((__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2> *)&sptr,this_00);
    InputList::add(&list,&sptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&value);
  }
  else {
    if (next_item->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*next_item->vtable->type)();
    }
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputList::typeinfo);
    if (bVar1) {
      pIVar2 = any_cast<Omega_h::InputList&&>(next_item);
      InputList::InputList((InputList *)&value,pIVar2);
      pIVar2 = (InputList *)operator_new(0x30);
      InputList::InputList(pIVar2,(InputList *)&value);
      std::__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Omega_h::InputList,void>
                ((__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2> *)&sptr,pIVar2);
      InputList::add(&list,&sptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      InputList::~InputList((InputList *)&value);
    }
    else {
      if (next_item->vtable == (vtable_type *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar3 = (*next_item->vtable->type)();
      }
      bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputMap::typeinfo);
      if (!bVar1) {
        this_01 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&value,"bug in InputYamlReader: unexpected type for sequence item",
                   (allocator *)&sptr);
        ParserFail::ParserFail(this_01,&value);
        __cxa_throw(this_01,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      pIVar5 = any_cast<Omega_h::InputMap&&>(next_item);
      InputMap::InputMap((InputMap *)&value,pIVar5);
      pIVar5 = (InputMap *)operator_new(0x48);
      InputMap::InputMap(pIVar5,(InputMap *)&value);
      std::__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Omega_h::InputMap,void>
                ((__shared_ptr<Omega_h::Input,(__gnu_cxx::_Lock_policy)2> *)&sptr,pIVar5);
      InputList::add(&list,&sptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      InputMap::~InputMap((InputMap *)&value);
    }
  }
  any::construct<Omega_h::InputList>(__return_storage_ptr__,&list);
  InputList::~InputList(&list);
  return __return_storage_ptr__;
}

Assistant:

any seq_next_item(any& items, any& next_item) {
    auto list = any_cast<InputList&&>(std::move(items));
    if (next_item.type() == typeid(std::string)) {
      std::string value = any_cast<std::string&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputScalar(std::move(value)));
      list.add(std::move(sptr));
    } else if (next_item.type() == typeid(InputList)) {
      InputList value = any_cast<InputList&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputList(std::move(value)));
      list.add(std::move(sptr));
    } else if (next_item.type() == typeid(InputMap)) {
      InputMap value = any_cast<InputMap&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputMap(std::move(value)));
      list.add(std::move(sptr));
    } else {
      throw ParserFail(
          "bug in InputYamlReader: unexpected type for sequence item");
    }
    return any(std::move(list));
  }